

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testDwaCompressorSimd.cpp
# Opt level: O3

void anon_unknown.dwarf_145e96::compareBuffer
               (SimdAlignedBuffer64f *src,SimdAlignedBuffer64f *dst,float errThresh)

{
  ostream *poVar1;
  long lVar2;
  float fVar3;
  
  lVar2 = 0;
  do {
    fVar3 = ABS(src->_buffer[lVar2] - dst->_buffer[lVar2]);
    if (0.001 < fVar3) {
      *(uint *)(std::__cxx11::string::find + *(long *)(std::cout + -0x18)) =
           *(uint *)(std::__cxx11::string::find + *(long *)(std::cout + -0x18)) & 0xfffffefb | 0x100
      ;
      poVar1 = std::operator<<((ostream *)&std::cout,"Error exceeded threshold on element ");
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,(int)lVar2);
      std::endl<char,std::char_traits<char>>(poVar1);
      poVar1 = std::operator<<((ostream *)&std::cout," diff: ");
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,(double)fVar3);
      std::endl<char,std::char_traits<char>>(poVar1);
      poVar1 = std::operator<<((ostream *)&std::cout,"Goal (src): ");
      *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) =
           *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) & 0xfffffefb | 0x100;
      std::endl<char,std::char_traits<char>>(poVar1);
      dumpBuffer(src);
      poVar1 = std::operator<<((ostream *)&std::cout,"Test (dst): ");
      std::endl<char,std::char_traits<char>>(poVar1);
      dumpBuffer(dst);
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testDwaCompressorSimd.cpp"
                    ,0x57,
                    "void (anonymous namespace)::compareBuffer(const SimdAlignedBuffer64f &, const SimdAlignedBuffer64f &, const float)"
                   );
    }
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0x40);
  return;
}

Assistant:

void
compareBuffer (const SimdAlignedBuffer64f &src,
               const SimdAlignedBuffer64f &dst,
               const float                 errThresh)
{
    for (int i=0; i<64; ++i) 
    {
        double diff   = fabs(src._buffer[i] - dst._buffer[i]);

        if (diff > errThresh) 
        {
            cout << scientific;
            cout << "Error exceeded threshold on element "  << i << endl;
            cout << " diff: " << diff << endl;
            cout << "Goal (src): " << scientific << endl;
            dumpBuffer(src);
            cout << "Test (dst): " << endl;
            dumpBuffer(dst);

            assert(false);
        }
    }
}